

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int mbedtls_asn1_get_sequence_of(uchar **p,uchar *end,mbedtls_asn1_sequence *cur,int tag)

{
  uchar *puVar1;
  size_t sVar2;
  byte *pbVar3;
  int iVar4;
  size_t in_RAX;
  mbedtls_asn1_sequence *pmVar5;
  size_t len;
  size_t local_28;
  
  puVar1 = *p;
  local_28 = in_RAX;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
    iVar4 = -0x60;
  }
  else {
    iVar4 = -0x62;
    if (*puVar1 == '0') {
      *p = puVar1 + 1;
      iVar4 = mbedtls_asn1_get_len(p,end,&local_28);
    }
  }
  if ((iVar4 == 0) && (iVar4 = -0x66, *p + local_28 == end)) {
    do {
      do {
        pbVar3 = *p;
        if (end <= pbVar3) {
          cur->next = (mbedtls_asn1_sequence *)0x0;
          if (*p != end) {
            return -0x66;
          }
          return 0;
        }
        (cur->buf).tag = (uint)*pbVar3;
        if (end == pbVar3 || (long)end - (long)pbVar3 < 0) {
          iVar4 = -0x60;
        }
        else {
          iVar4 = -0x62;
          if ((uint)*pbVar3 == tag) {
            *p = pbVar3 + 1;
            iVar4 = mbedtls_asn1_get_len(p,end,&(cur->buf).len);
          }
        }
        if (iVar4 != 0) {
          return iVar4;
        }
        (cur->buf).p = *p;
        puVar1 = *p;
        sVar2 = (cur->buf).len;
        *p = puVar1 + sVar2;
      } while (end <= puVar1 + sVar2);
      pmVar5 = (mbedtls_asn1_sequence *)calloc(1,0x20);
      cur->next = pmVar5;
      cur = pmVar5;
    } while (pmVar5 != (mbedtls_asn1_sequence *)0x0);
    iVar4 = -0x6a;
  }
  return iVar4;
}

Assistant:

int mbedtls_asn1_get_sequence_of( unsigned char **p,
                          const unsigned char *end,
                          mbedtls_asn1_sequence *cur,
                          int tag)
{
    int ret;
    size_t len;
    mbedtls_asn1_buf *buf;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        buf = &(cur->buf);
        buf->tag = **p;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &buf->len, tag ) ) != 0 )
            return( ret );

        buf->p = *p;
        *p += buf->len;

        /* Allocate and assign next pointer */
        if( *p < end )
        {
            cur->next = mbedtls_calloc( 1, sizeof( mbedtls_asn1_sequence ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_ASN1_ALLOC_FAILED );

            cur = cur->next;
        }
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}